

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

Vec_Ptr_t * Dar_BalanceCone(Aig_Obj_t *pObj,Vec_Vec_t *vStore,int Level)

{
  uint __line;
  Vec_Ptr_t *pVVar1;
  Aig_Obj_t *pObj_00;
  char *__assertion;
  long lVar2;
  
  if (((ulong)pObj & 1) == 0) {
    if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
      if (vStore->nSize <= Level) {
        Vec_PtrGrow((Vec_Ptr_t *)vStore,Level + 1);
        for (lVar2 = (long)vStore->nSize; lVar2 <= Level; lVar2 = lVar2 + 1) {
          pVVar1 = Vec_PtrAlloc(0);
          vStore->pArray[lVar2] = pVVar1;
        }
        vStore->nSize = Level + 1;
        pVVar1 = Vec_VecEntry(vStore,Level);
        Vec_PtrPush(pVVar1,(void *)0x0);
      }
      pVVar1 = Vec_VecEntry(vStore,Level);
      pVVar1->nSize = 0;
      pObj_00 = pObj;
      Dar_BalanceCone_rec(pObj,pObj,pVVar1);
      Dar_BalanceUniqify(pObj_00,pVVar1,(uint)((*(uint *)&pObj->field_0x18 & 7) == 6));
      return pVVar1;
    }
    __assertion = "Aig_ObjIsNode(pObj)";
    __line = 0x7b;
  }
  else {
    __assertion = "!Aig_IsComplement(pObj)";
    __line = 0x7a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                ,__line,"Vec_Ptr_t *Dar_BalanceCone(Aig_Obj_t *, Vec_Vec_t *, int)");
}

Assistant:

Vec_Ptr_t * Dar_BalanceCone( Aig_Obj_t * pObj, Vec_Vec_t * vStore, int Level )
{
    Vec_Ptr_t * vNodes;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    // extend the storage
    if ( Vec_VecSize( vStore ) <= Level )
        Vec_VecPush( vStore, Level, 0 );
    // get the temporary array of nodes
    vNodes = Vec_VecEntry( vStore, Level );
    Vec_PtrClear( vNodes );
    // collect the nodes in the implication supergate
    Dar_BalanceCone_rec( pObj, pObj, vNodes );
    // remove duplicates
    Dar_BalanceUniqify( pObj, vNodes, Aig_ObjIsExor(pObj) );
    return vNodes;
}